

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_treeops.c
# Opt level: O3

_Bool names_are_equal(nbt_node *node,void *vname)

{
  char *__s1;
  int iVar1;
  _Bool _Var2;
  
  if (node != (nbt_node *)0x0) {
    __s1 = node->name;
    _Var2 = vname == (void *)0x0 && __s1 == (char *)0x0;
    if (__s1 != (char *)0x0 && vname != (void *)0x0) {
      iVar1 = strcmp(__s1,(char *)vname);
      _Var2 = iVar1 == 0;
    }
    return _Var2;
  }
  __assert_fail("node",
                "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_treeops.c",
                0x18e,"_Bool names_are_equal(const nbt_node *, void *)");
}

Assistant:

static bool names_are_equal(const nbt_node* node, void* vname)
{
    const char* name = vname;

    assert(node);

    if(name == NULL && node->name == NULL)
        return true;

    if(name == NULL || node->name == NULL)
        return false;

    return strcmp(node->name, name) == 0;
}